

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.c
# Opt level: O2

_Bool cs_insn_group(csh ud,cs_insn *insn,uint group_id)

{
  cs_detail *pcVar1;
  _Bool _Var2;
  
  if (ud != 0) {
    if (*(int *)(ud + 0x60) != 0) {
      if (insn->id == 0) {
        *(undefined4 *)(ud + 0x50) = 0xb;
        return false;
      }
      pcVar1 = insn->detail;
      if (pcVar1 != (cs_detail *)0x0) {
        _Var2 = arr_exist8(pcVar1->groups,pcVar1->groups_count,group_id);
        return _Var2;
      }
    }
    *(undefined4 *)(ud + 0x50) = 7;
  }
  return false;
}

Assistant:

CAPSTONE_API cs_insn_group(csh ud, const cs_insn *insn, unsigned int group_id)
{
	struct cs_struct *handle;
	if (!ud)
		return false;

	handle = (struct cs_struct *)(uintptr_t)ud;

	if (!handle->detail) {
		handle->errnum = CS_ERR_DETAIL;
		return false;
	}

	if (!insn->id) {
		handle->errnum = CS_ERR_SKIPDATA;
		return false;
	}

	if (!insn->detail) {
		handle->errnum = CS_ERR_DETAIL;
		return false;
	}

	return arr_exist8(insn->detail->groups, insn->detail->groups_count, group_id);
}